

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O2

void __thiscall
adios2::plugin::PluginOperator::PluginOperator(PluginOperator *this,Params *parameters)

{
  Params *this_00;
  _Rb_tree_header *p_Var1;
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  *puVar2;
  Impl *pIVar3;
  iterator iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,"plugin",&local_69);
  std::__cxx11::string::string((string *)&local_48,"plugin",&local_6a);
  core::Operator::Operator(&this->super_Operator,&local_68,PLUGIN_INTERFACE,&local_48,parameters);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__PluginOperator_00821860;
  pIVar3 = (Impl *)operator_new(0x80);
  puVar2 = &this->m_Impl;
  (((_Rb_tree_header *)((long)&(pIVar3->m_PluginParams)._M_t + 8))->_M_header)._M_color = _S_red;
  p_Var7 = (_Base_ptr)((long)&(pIVar3->m_PluginParams)._M_t + 8);
  *(_Base_ptr *)((long)&(pIVar3->m_PluginParams)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(pIVar3->m_PluginParams)._M_t + 0x18) = p_Var7;
  *(_Base_ptr *)((long)&(pIVar3->m_PluginParams)._M_t + 0x20) = p_Var7;
  *(size_t *)((long)&(pIVar3->m_PluginParams)._M_t + 0x28) = 0;
  *(undefined8 *)&(pIVar3->m_HandleCreate).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pIVar3->m_HandleCreate).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&(pIVar3->m_HandleCreate).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  (pIVar3->m_HandleCreate)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(pIVar3->m_HandleDestroy).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pIVar3->m_HandleDestroy).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&(pIVar3->m_HandleDestroy).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  (pIVar3->m_HandleDestroy)._M_invoker = (_Invoker_type)0x0;
  pIVar3->m_Plugin = (PluginOperatorInterface *)0x0;
  pIVar3->m_Verbosity = 0;
  (this->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl = pIVar3;
  std::__cxx11::string::string((string *)&local_68,"verbose",(allocator *)&local_48);
  this_00 = &(this->super_Operator).m_Parameters;
  helper::GetParameter<int>
            (this_00,&local_68,
             &((puVar2->_M_t).
               super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
               .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl)->
              m_Verbosity);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"pluginname",(allocator *)&local_48);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"pluginlibrary",(allocator *)&local_48);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  p_Var1 = &(this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1 && (_Rb_tree_header *)iVar4._M_node != p_Var1) {
    pIVar3 = (puVar2->_M_t).
             super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_68,"PluginName",(allocator *)&local_48);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pIVar3->m_PluginParams,&local_68);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_68);
    pIVar3 = (puVar2->_M_t).
             super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_68,"PluginLibrary",(allocator *)&local_48);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pIVar3->m_PluginParams,&local_68);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_68);
    PluginInit(this,(string *)(iVar4._M_node + 2),(string *)(iVar5._M_node + 2));
  }
  return;
}

Assistant:

PluginOperator::PluginOperator(const Params &parameters)
: Operator("plugin", PLUGIN_INTERFACE, "plugin", parameters), m_Impl(new Impl)
{
    helper::GetParameter(m_Parameters, "verbose", m_Impl->m_Verbosity);

    // It is possible for 'pluginname' and 'pluginlibrary' to not be in
    // m_Parameters (e.g., when using bpls, which will call InverseOperate).
    // PluginName and PluginLibrary which will be saved in header info in the
    // Operate() call, so that in this situation, the plugin can be loaded
    // to perform InverseOperate.
    auto pluginNameIt = m_Parameters.find("pluginname");
    auto pluginLibIt = m_Parameters.find("pluginlibrary");
    if (pluginNameIt != m_Parameters.end() && pluginLibIt != m_Parameters.end())
    {
        m_Impl->m_PluginParams["PluginName"] = pluginNameIt->second;
        m_Impl->m_PluginParams["PluginLibrary"] = pluginLibIt->second;
        PluginInit(pluginNameIt->second, pluginLibIt->second);
    }
}